

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::ConductorBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,ConductorBxDF *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TrowbridgeReitzDistribution_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,"[ ConductorBxDF mfDistrib: %s eta: %s k: %s ]",&this->mfDistrib
             ,&this->eta,&this->k);
  return __return_storage_ptr__;
}

Assistant:

std::string ConductorBxDF::ToString() const {
    return StringPrintf("[ ConductorBxDF mfDistrib: %s eta: %s k: %s ]", mfDistrib, eta,
                        k);
}